

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O1

void __thiscall ON_BinaryArchive::Internal_ReportCRCError(ON_BinaryArchive *this)

{
  uint *puVar1;
  ON_3dmTableStatusLink *pOVar2;
  
  this->m_crc_error_count = this->m_crc_error_count + 1;
  pOVar2 = this->m_3dm_table_status_list;
  if (((pOVar2 != (ON_3dmTableStatusLink *)0x0) &&
      (this->m_3dm_active_table == (pOVar2->m_table_status).m_table_type)) &&
     ((pOVar2->m_table_status).m_state != Finished)) {
    puVar1 = &(pOVar2->m_table_status).m_crc_error_count;
    *puVar1 = *puVar1 + 1;
  }
  return;
}

Assistant:

void ON_BinaryArchive::Internal_ReportCRCError()
{
  m_crc_error_count++;
  if (nullptr != m_3dm_table_status_list 
    && m_3dm_active_table == m_3dm_table_status_list->m_table_status.m_table_type
    && ON_3dmArchiveTableStatus::TableState::Finished !=  m_3dm_table_status_list->m_table_status.m_state
    )
  {
    m_3dm_table_status_list->m_table_status.m_crc_error_count++;
  }
  return;
}